

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xstring.c
# Opt level: O0

int capacity_expand(xstr_t *xs,size_t size)

{
  void *pvVar1;
  char *pcVar2;
  void *new_data;
  size_t new_cap;
  size_t size_local;
  xstr_t *xs_local;
  
  new_data = (void *)(xs->capacity << 1);
  pvVar1 = (void *)(xs->size + 1 + size);
  if (new_data < pvVar1) {
    new_data = pvVar1;
  }
  pcVar2 = (char *)realloc(xs->data,(size_t)new_data);
  if (pcVar2 == (char *)0x0) {
    xs_local._4_4_ = -1;
  }
  else {
    xs->data = pcVar2;
    xs->capacity = (size_t)new_data;
    xs_local._4_4_ = 0;
  }
  return xs_local._4_4_;
}

Assistant:

static int capacity_expand(xstr_t* xs, size_t size)
{
    size_t new_cap = xs->capacity << 1; /* xs->capacity * 2; */
    void* new_data;

    size += xs->size + 1; /* leave 1 null-terminated */

    if (new_cap < size) new_cap = size;

    new_data = realloc(xs->data, new_cap);

    if (new_data)
    {
        xs->data = new_data;
        xs->capacity = new_cap;
        return 0;
    }

    return -1;
}